

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstructionType
anon_unknown.dwarf_1a3010::GetStoreInstruction(ExpressionContext *ctx,TypeBase *type)

{
  bool bVar1;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  
  if ((type == ctx->typeBool) || (type == ctx->typeChar)) {
    ctx_local._4_4_ = VM_INST_STORE_BYTE;
  }
  else if (type == ctx->typeShort) {
    ctx_local._4_4_ = VM_INST_STORE_SHORT;
  }
  else if (type == ctx->typeInt) {
    ctx_local._4_4_ = VM_INST_STORE_INT;
  }
  else if (type == ctx->typeFloat) {
    ctx_local._4_4_ = VM_INST_STORE_FLOAT;
  }
  else if (type == ctx->typeDouble) {
    ctx_local._4_4_ = VM_INST_STORE_DOUBLE;
  }
  else if (type == ctx->typeLong) {
    ctx_local._4_4_ = VM_INST_STORE_LONG;
  }
  else {
    bVar1 = isType<TypeRef>(type);
    if (bVar1) {
      ctx_local._4_4_ = VM_INST_STORE_LONG;
    }
    else {
      bVar1 = isType<TypeEnum>(type);
      if (bVar1) {
        ctx_local._4_4_ = VM_INST_STORE_INT;
      }
      else {
        bVar1 = isType<TypeFunction>(type);
        if ((((!bVar1) && (bVar1 = isType<TypeUnsizedArray>(type), !bVar1)) &&
            ((TypeStruct *)type != ctx->typeAutoRef)) && ((TypeStruct *)type != ctx->typeAutoArray))
        {
          bVar1 = isType<TypeTypeID>(type);
          if (((bVar1) || (bVar1 = isType<TypeFunctionID>(type), bVar1)) ||
             (bVar1 = isType<TypeEnum>(type), bVar1)) {
            return VM_INST_STORE_INT;
          }
          bVar1 = isType<TypeNullptr>(type);
          if (bVar1) {
            return VM_INST_STORE_LONG;
          }
          if (type->size != 0) {
            if (type->size % 4 != 0) {
              __assert_fail("type->size % 4 == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1bb,
                            "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                           );
            }
            if (type->size < 0x10000000) {
              return VM_INST_STORE_STRUCT;
            }
            __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1bc,
                          "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                         );
          }
          __assert_fail("type->size != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1ba,
                        "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                       );
        }
        ctx_local._4_4_ = VM_INST_STORE_STRUCT;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}